

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_monte_carlo.cpp
# Opt level: O1

double * triangle01_sample(int n,int *seed)

{
  double *pdVar1;
  double *a;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  double dVar5;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar3 = (long)(n * 2) << 3;
  }
  pdVar1 = (double *)operator_new__(uVar3);
  if (0 < n) {
    uVar3 = 0;
    pdVar4 = pdVar1;
    do {
      a = r8vec_uniform_01_new(3,seed);
      lVar2 = 0;
      do {
        dVar5 = log(a[lVar2]);
        a[lVar2] = -dVar5;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      dVar5 = r8vec_sum(3,a);
      lVar2 = 0;
      do {
        pdVar4[lVar2] = a[lVar2] / dVar5;
        lVar2 = lVar2 + 1;
      } while (lVar2 == 1);
      if (a != (double *)0x0) {
        operator_delete__(a);
      }
      uVar3 = uVar3 + 1;
      pdVar4 = pdVar4 + 2;
    } while (uVar3 != (uint)n);
  }
  return pdVar1;
}

Assistant:

double *triangle01_sample ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE01_SAMPLE samples from the interior of the unit triangle in 2D.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Reuven Rubinstein,
//    Monte Carlo Optimization, Simulation, and Sensitivity
//    of Queueing Networks,
//    Krieger, 1992,
//    ISBN: 0894647644,
//    LC: QA298.R79.
//
//  Parameters:
//
//    Input, int N, the number of points.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double TRIANGLE01_SAMPLE[2*N], the points.
//
{
  double *e;
  double e_sum;
  int i;
  int j;
  const int m = 2;
  double *x;

  x = new double[m*n];

  for ( j = 0; j < n; j++ )
  {
    e = r8vec_uniform_01_new ( m + 1, seed );

    for ( i = 0; i < m + 1; i++ )
    {
      e[i] = - log ( e[i] );
    }

    e_sum = r8vec_sum ( m + 1, e );

    for ( i = 0; i < m; i++ )
    {
      x[i+j*m] = e[i] / e_sum;
    }
    delete [] e;
  }

  return x;
}